

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

uint8_t bcm2835_gpio_get_pud(uint8_t pin)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *paddr;
  uint32_t bits;
  uint8_t ret;
  uint8_t pin_local;
  
  paddr._6_1_ = '\b';
  if (pud_type_rpi4 != '\0') {
    uVar1 = bcm2835_peri_read_nb((uint32_t *)((long)bcm2835_gpio + (ulong)(pin >> 2 & 0x3c) + 0xe4))
    ;
    uVar2 = uVar1 >> (pin & 0xf) * '\x02' & 3;
    if (uVar2 == 0) {
      paddr._6_1_ = '\0';
    }
    else if (uVar2 == 1) {
      paddr._6_1_ = '\x02';
    }
    else if (uVar2 == 2) {
      paddr._6_1_ = '\x01';
    }
    else {
      paddr._6_1_ = '\b';
    }
  }
  return paddr._6_1_;
}

Assistant:

uint8_t bcm2835_gpio_get_pud(uint8_t pin)
{
    uint8_t ret = BCM2835_GPIO_PUD_ERROR;
    
    if( pud_type_rpi4 )
    {
        uint32_t bits;
        volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPPUPPDN0/4 + (pin >> 4);
        bits = (bcm2835_peri_read_nb( paddr ) >> ((pin & 0xf)<<1)) & 0x3;
        
        switch (bits)
        {
            case 0: ret = BCM2835_GPIO_PUD_OFF; break;
            case 1: ret = BCM2835_GPIO_PUD_UP; break;
            case 2: ret = BCM2835_GPIO_PUD_DOWN; break;
            default: ret = BCM2835_GPIO_PUD_ERROR;
        }   
    }
    
    return ret;
}